

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase *this,Context *context,char *name,char *desc,char *varName,
          deUint32 paramName,bool isVertexCase)

{
  char *__s;
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  allocator<char> local_36;
  byte local_35;
  deUint32 local_34;
  bool isVertexCase_local;
  char *pcStack_30;
  deUint32 paramName_local;
  char *varName_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ShaderBuiltinConstantCase *this_local;
  
  local_35 = isVertexCase;
  local_34 = paramName;
  pcStack_30 = varName;
  varName_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  testCtx = gles2::Context::getTestContext(context);
  renderCtx = gles2::Context::getRenderContext((Context *)name_local);
  ctxInfo = gles2::Context::getContextInfo((Context *)name_local);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,desc_local,varName_local,
             (bool)(local_35 & 1),evalBuiltinConstant);
  __s = pcStack_30;
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_032880d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_varName,__s,&local_36);
  std::allocator<char>::~allocator(&local_36);
  this->m_paramName = local_34;
  return;
}

Assistant:

ShaderBuiltinConstantCase::ShaderBuiltinConstantCase (Context& context, const char* name, const char* desc, const char* varName, deUint32 paramName, bool isVertexCase)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, desc, isVertexCase, evalBuiltinConstant)
	, m_varName			(varName)
	, m_paramName		(paramName)
{
}